

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O1

void __thiscall DisasmReplayer::~DisasmReplayer(DisasmReplayer *this)

{
  pointer ppVVar1;
  pointer ppVVar2;
  pointer ppVVar3;
  pointer ppVVar4;
  pointer ppVVar5;
  pointer ppVVar6;
  pointer puVar7;
  pointer ppVVar8;
  pointer ppVVar9;
  pointer ppVVar10;
  pointer ppvVar11;
  pointer ppVVar12;
  pointer ppVVar13;
  pointer ppVVar14;
  pointer ppVVar15;
  VkSampler_T **sampler;
  pointer ppVVar16;
  pointer ppVVar17;
  pointer ppVVar18;
  pointer ppVVar19;
  pointer ppVVar20;
  pointer ppVVar21;
  
  (this->super_StateCreatorInterface)._vptr_StateCreatorInterface =
       (_func_int **)&PTR__DisasmReplayer_004c14f8;
  if (this->device != (VulkanDevice *)0x0) {
    if (this->pipeline_cache != (VkPipelineCache)0x0) {
      (*vkDestroyPipelineCache)
                (this->device->device,this->pipeline_cache,(VkAllocationCallbacks *)0x0);
    }
    ppVVar1 = (this->samplers).super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppVVar16 = (this->samplers).
                    super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppVVar16 != ppVVar1; ppVVar16 = ppVVar16 + 1)
    {
      if (*ppVVar16 != (VkSampler)0x0) {
        (*vkDestroySampler)(this->device->device,*ppVVar16,(VkAllocationCallbacks *)0x0);
      }
    }
    ppVVar2 = (this->layouts).
              super__Vector_base<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVVar17 = (this->layouts).
                    super__Vector_base<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVVar17 != ppVVar2;
        ppVVar17 = ppVVar17 + 1) {
      if (*ppVVar17 != (VkDescriptorSetLayout)0x0) {
        (*vkDestroyDescriptorSetLayout)(this->device->device,*ppVVar17,(VkAllocationCallbacks *)0x0)
        ;
      }
    }
    ppVVar3 = (this->pipeline_layouts).
              super__Vector_base<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppVVar18 = (this->pipeline_layouts).
                    super__Vector_base<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppVVar18 != ppVVar3;
        ppVVar18 = ppVVar18 + 1) {
      if (*ppVVar18 != (VkPipelineLayout)0x0) {
        (*vkDestroyPipelineLayout)(this->device->device,*ppVVar18,(VkAllocationCallbacks *)0x0);
      }
    }
    ppVVar4 = (this->shader_modules).
              super__Vector_base<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar19 = (this->shader_modules).
                    super__Vector_base<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppVVar19 != ppVVar4;
        ppVVar19 = ppVVar19 + 1) {
      if (*ppVVar19 != (VkShaderModule)0x0) {
        (*vkDestroyShaderModule)(this->device->device,*ppVVar19,(VkAllocationCallbacks *)0x0);
      }
    }
    ppVVar5 = (this->render_passes).
              super__Vector_base<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar20 = (this->render_passes).
                    super__Vector_base<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppVVar20 != ppVVar5; ppVVar20 = ppVVar20 + 1)
    {
      if (*ppVVar20 != (VkRenderPass)0x0) {
        (*vkDestroyRenderPass)(this->device->device,*ppVVar20,(VkAllocationCallbacks *)0x0);
      }
    }
    ppVVar6 = (this->compute_pipelines).
              super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar21 = (this->compute_pipelines).
                    super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppVVar21 != ppVVar6; ppVVar21 = ppVVar21 + 1)
    {
      if (*ppVVar21 != (VkPipeline)0x0) {
        (*vkDestroyPipeline)(this->device->device,*ppVVar21,(VkAllocationCallbacks *)0x0);
      }
    }
    ppVVar6 = (this->graphics_pipelines).
              super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar21 = (this->graphics_pipelines).
                    super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppVVar21 != ppVVar6; ppVVar21 = ppVVar21 + 1)
    {
      if (*ppVVar21 != (VkPipeline)0x0) {
        (*vkDestroyPipeline)(this->device->device,*ppVVar21,(VkAllocationCallbacks *)0x0);
      }
    }
    ppVVar6 = (this->raytracing_pipelines).
              super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar21 = (this->raytracing_pipelines).
                    super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppVVar21 != ppVVar6; ppVVar21 = ppVVar21 + 1)
    {
      if (*ppVVar21 != (VkPipeline)0x0) {
        (*vkDestroyPipeline)(this->device->device,*ppVVar21,(VkAllocationCallbacks *)0x0);
      }
    }
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->filter_modules)._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->filter_raytracing)._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->filter_compute)._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->filter_graphics)._M_h);
  ppVVar21 = (this->raytracing_pipelines).
             super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppVVar21 != (pointer)0x0) {
    operator_delete(ppVVar21,(long)(this->raytracing_pipelines).
                                   super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar21);
  }
  ppVVar21 = (this->graphics_pipelines).
             super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppVVar21 != (pointer)0x0) {
    operator_delete(ppVVar21,(long)(this->graphics_pipelines).
                                   super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar21);
  }
  ppVVar21 = (this->compute_pipelines).
             super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppVVar21 != (pointer)0x0) {
    operator_delete(ppVVar21,(long)(this->compute_pipelines).
                                   super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar21);
  }
  ppVVar20 = (this->render_passes).
             super__Vector_base<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppVVar20 != (pointer)0x0) {
    operator_delete(ppVVar20,(long)(this->render_passes).
                                   super__Vector_base<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar20);
  }
  ppVVar19 = (this->shader_modules).
             super__Vector_base<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppVVar19 != (pointer)0x0) {
    operator_delete(ppVVar19,(long)(this->shader_modules).
                                   super__Vector_base<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar19);
  }
  ppVVar18 = (this->pipeline_layouts).
             super__Vector_base<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (ppVVar18 != (pointer)0x0) {
    operator_delete(ppVVar18,(long)(this->pipeline_layouts).
                                   super__Vector_base<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar18);
  }
  ppVVar17 = (this->layouts).
             super__Vector_base<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppVVar17 != (pointer)0x0) {
    operator_delete(ppVVar17,(long)(this->layouts).
                                   super__Vector_base<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar17);
  }
  ppVVar16 = (this->samplers).super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppVVar16 != (pointer)0x0) {
    operator_delete(ppVVar16,(long)(this->samplers).
                                   super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar16);
  }
  std::
  _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->module_to_index)._M_h);
  puVar7 = (this->module_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)(this->module_hashes).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7);
  }
  puVar7 = (this->raytracing_hashes).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)(this->raytracing_hashes).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7);
  }
  puVar7 = (this->compute_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)(this->compute_hashes).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7);
  }
  puVar7 = (this->graphics_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)(this->graphics_hashes).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7);
  }
  ppVVar8 = (this->raytracing_infos).
            super__Vector_base<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVVar8 != (pointer)0x0) {
    operator_delete(ppVVar8,(long)(this->raytracing_infos).
                                  super__Vector_base<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar8
                   );
  }
  ppVVar9 = (this->compute_infos).
            super__Vector_base<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVVar9 != (pointer)0x0) {
    operator_delete(ppVVar9,(long)(this->compute_infos).
                                  super__Vector_base<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar9
                   );
  }
  ppVVar10 = (this->graphics_infos).
             super__Vector_base<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppVVar10 != (pointer)0x0) {
    operator_delete(ppVVar10,(long)(this->graphics_infos).
                                   super__Vector_base<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar10);
  }
  ppvVar11 = (this->render_pass_infos).
             super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppvVar11 != (pointer)0x0) {
    operator_delete(ppvVar11,(long)(this->render_pass_infos).
                                   super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppvVar11);
  }
  ppVVar12 = (this->shader_module_infos).
             super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppVVar12 != (pointer)0x0) {
    operator_delete(ppVVar12,(long)(this->shader_module_infos).
                                   super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar12);
  }
  ppVVar13 = (this->pipeline_layout_infos).
             super__Vector_base<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppVVar13 != (pointer)0x0) {
    operator_delete(ppVVar13,(long)(this->pipeline_layout_infos).
                                   super__Vector_base<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar13);
  }
  ppVVar14 = (this->set_layout_infos).
             super__Vector_base<const_VkDescriptorSetLayoutCreateInfo_*,_std::allocator<const_VkDescriptorSetLayoutCreateInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppVVar14 != (pointer)0x0) {
    operator_delete(ppVVar14,(long)(this->set_layout_infos).
                                   super__Vector_base<const_VkDescriptorSetLayoutCreateInfo_*,_std::allocator<const_VkDescriptorSetLayoutCreateInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar14);
  }
  ppVVar15 = (this->sampler_infos).
             super__Vector_base<const_VkSamplerCreateInfo_*,_std::allocator<const_VkSamplerCreateInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppVVar15 != (pointer)0x0) {
    operator_delete(ppVVar15,(long)(this->sampler_infos).
                                   super__Vector_base<const_VkSamplerCreateInfo_*,_std::allocator<const_VkSamplerCreateInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppVVar15);
    return;
  }
  return;
}

Assistant:

~DisasmReplayer()
	{
		if (device)
		{
			if (pipeline_cache)
				vkDestroyPipelineCache(device->get_device(), pipeline_cache, nullptr);
			for (auto &sampler : samplers)
				if (sampler)
					vkDestroySampler(device->get_device(), sampler, nullptr);
			for (auto &layout : layouts)
				if (layout)
					vkDestroyDescriptorSetLayout(device->get_device(), layout, nullptr);
			for (auto &pipeline_layout : pipeline_layouts)
				if (pipeline_layout)
					vkDestroyPipelineLayout(device->get_device(), pipeline_layout, nullptr);
			for (auto &shader_module : shader_modules)
				if (shader_module)
					vkDestroyShaderModule(device->get_device(), shader_module, nullptr);
			for (auto &render_pass : render_passes)
				if (render_pass)
					vkDestroyRenderPass(device->get_device(), render_pass, nullptr);
			for (auto &pipeline : compute_pipelines)
				if (pipeline)
					vkDestroyPipeline(device->get_device(), pipeline, nullptr);
			for (auto &pipeline : graphics_pipelines)
				if (pipeline)
					vkDestroyPipeline(device->get_device(), pipeline, nullptr);
			for (auto &pipeline : raytracing_pipelines)
				if (pipeline)
					vkDestroyPipeline(device->get_device(), pipeline, nullptr);
		}
	}